

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O3

void __thiscall
QFontFamilyDelegate::QFontFamilyDelegate
          (QFontFamilyDelegate *this,QObject *parent,QFontComboBoxPrivate *comboP)

{
  long in_FS_OFFSET;
  QArrayData *local_38;
  char16_t *local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemDelegate::QAbstractItemDelegate((QAbstractItemDelegate *)this,parent);
  *(undefined ***)&this->super_QAbstractItemDelegate = &PTR_metaObject_007f2e70;
  local_38 = (QArrayData *)0x0;
  local_30 = L":/qt-project.org/styles/commonstyle/images/fonttruetype-16.png";
  local_28 = 0x3e;
  QIcon::QIcon(&this->truetype,(QString *)&local_38);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,0x10);
    }
  }
  local_38 = (QArrayData *)0x0;
  local_30 = L":/qt-project.org/styles/commonstyle/images/fontbitmap-16.png";
  local_28 = 0x3c;
  QIcon::QIcon(&this->bitmap,(QString *)&local_38);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,0x10);
    }
  }
  this->writingSystem = Any;
  this->comboPrivate = comboP;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFontFamilyDelegate::QFontFamilyDelegate(QObject *parent, QFontComboBoxPrivate *comboP)
    : QAbstractItemDelegate(parent),
      truetype(QStringLiteral(":/qt-project.org/styles/commonstyle/images/fonttruetype-16.png")),
      bitmap(QStringLiteral(":/qt-project.org/styles/commonstyle/images/fontbitmap-16.png")),
      writingSystem(QFontDatabase::Any),
      comboPrivate(comboP)
{
}